

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O0

void SequenceTask_DemoLDF::initialize(search *sch,size_t *num_actions,options_i *param_3)

{
  example *peVar1;
  task_data *data_00;
  ulong *in_RSI;
  search *in_RDI;
  task_data *data;
  label *lab;
  size_t a;
  example *ldf_examples;
  wclass default_wclass;
  uint32_t in_stack_0000018c;
  search *in_stack_00000190;
  wclass *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  v_array<COST_SENSITIVE::wclass> *this;
  size_t in_stack_ffffffffffffffc8;
  ulong uVar2;
  undefined1 local_28 [24];
  ulong *local_10;
  search *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_28,0,0x10);
  peVar1 = VW::alloc_examples(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  for (uVar2 = 0; uVar2 < *local_10; uVar2 = uVar2 + 1) {
    this = (v_array<COST_SENSITIVE::wclass> *)&peVar1[uVar2].l;
    (*(code *)COST_SENSITIVE::cs_label)(this);
    v_array<COST_SENSITIVE::wclass>::push_back(this,in_stack_ffffffffffffffb8);
  }
  data_00 = calloc_or_throw<SequenceTask_DemoLDF::task_data>();
  data_00->ldf_examples = peVar1;
  data_00->num_actions = *local_10;
  Search::search::set_task_data<SequenceTask_DemoLDF::task_data>(local_8,data_00);
  Search::search::set_options(in_stack_00000190,in_stack_0000018c);
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& num_actions, options_i& /*options*/)
{
  CS::wclass default_wclass = {0., 0, 0., 0.};

  example* ldf_examples = VW::alloc_examples(sizeof(CS::label), num_actions);
  for (size_t a = 0; a < num_actions; a++)
  {
    CS::label& lab = ldf_examples[a].l.cs;
    CS::cs_label.default_label(&lab);
    lab.costs.push_back(default_wclass);
  }

  task_data* data = &calloc_or_throw<task_data>();
  data->ldf_examples = ldf_examples;
  data->num_actions = num_actions;

  sch.set_task_data<task_data>(data);
  sch.set_options(Search::AUTO_CONDITION_FEATURES |  // automatically add history features to our examples, please
      Search::AUTO_HAMMING_LOSS |  // please just use hamming loss on individual predictions -- we won't declare loss
      Search::IS_LDF);             // we generate ldf examples
}